

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inferdeclnode.cpp
# Opt level: O0

void __thiscall
InferDeclNode::check
          (InferDeclNode *this,
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
          *tables)

{
  bool bVar1;
  pointer pVVar2;
  SemanticException *this_00;
  size_type sVar3;
  map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
  *this_01;
  pointer pAVar4;
  string local_1d0;
  string local_1b0;
  allocator local_189;
  string local_188;
  SymbolInfo local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_108;
  string local_88 [8];
  string varScope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  *local_18;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  *tables_local;
  InferDeclNode *this_local;
  
  local_18 = tables;
  tables_local = (vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                  *)this;
  pVVar2 = std::unique_ptr<VarNode,_std::default_delete<VarNode>_>::operator->(&this->lhs);
  bVar1 = wasDeclared(tables,&pVVar2->name);
  if (!bVar1) {
    std::__cxx11::string::string(local_88);
    sVar3 = std::
            vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
            ::size(local_18);
    if (sVar3 == 1) {
      std::__cxx11::string::operator=(local_88,"global");
    }
    else {
      std::__cxx11::string::operator=(local_88,"local");
    }
    this_01 = (map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
               *)std::
                 vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                 ::back(local_18);
    pVVar2 = std::unique_ptr<VarNode,_std::default_delete<VarNode>_>::operator->(&this->lhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,"var",&local_189);
    pAVar4 = std::unique_ptr<ASTNode,_std::default_delete<ASTNode>_>::operator->(&this->rhs);
    (*pAVar4->_vptr_ASTNode[6])(&local_1b0);
    std::__cxx11::string::string((string *)&local_1d0,local_88);
    SymbolInfo::SymbolInfo(&local_168,&local_188,&local_1b0,&local_1d0);
    std::make_pair<std::__cxx11::string&,SymbolInfo>(&local_108,&pVVar2->name,&local_168);
    std::
    map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
    ::emplace<std::pair<std::__cxx11::string,SymbolInfo>>(this_01,&local_108);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::~pair(&local_108);
    SymbolInfo::~SymbolInfo(&local_168);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::__cxx11::string::~string(local_88);
    return;
  }
  varScope.field_2._M_local_buf[0xb] = '\x01';
  this_00 = (SemanticException *)__cxa_allocate_exception(0x10);
  pVVar2 = std::unique_ptr<VarNode,_std::default_delete<VarNode>_>::operator->(&this->lhs);
  std::operator+(&local_58,"error: multiple definition of \'",&pVVar2->name);
  std::operator+(&local_38,&local_58,"\'");
  SemanticException::SemanticException(this_00,&local_38);
  varScope.field_2._M_local_buf[0xb] = '\0';
  __cxa_throw(this_00,&SemanticException::typeinfo,SemanticException::~SemanticException);
}

Assistant:

void InferDeclNode::check(std::vector<SymbolTable>& tables) {
    if (wasDeclared(tables, lhs->name)) {
        throw SemanticException("error: multiple definition of '" + lhs->name + "'");
    } else {
        auto varScope = std::string();
        if (tables.size() == 1) {
            varScope = "global";
        } else {
            varScope = "local";
        }

        tables.back().emplace(std::make_pair(lhs->name, SymbolInfo("var", rhs->getType(), varScope)));
//        std::cout << "new var added to table: named " << lhs->name << ", type: "
//                  << rhs->getType() << ", scope: " << varScope << "\n";
    }
}